

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  *ip = 0;
  if (n < 9) {
    if (n != 8) {
      return;
    }
    uVar4 = 2;
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    do {
      uVar5 = uVar6;
      n = (uint)n >> 1;
      if (0 < (int)uVar5) {
        uVar9 = 0;
        do {
          ip[uVar5 + uVar9] = ip[uVar9] + n;
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      uVar6 = uVar5 * 2;
    } while ((int)(uVar5 * 0x10) < n);
    uVar4 = uVar5 * 4;
    if (uVar5 * 0x10 != n) {
      if ((int)uVar6 < 2) {
        return;
      }
      uVar9 = 1;
      do {
        pdVar10 = a + ip[uVar9];
        uVar11 = 0;
        do {
          lVar14 = (long)ip[uVar11] + (long)((int)uVar9 * 2);
          dVar1 = *pdVar10;
          dVar2 = pdVar10[1];
          dVar3 = (a + lVar14)[1];
          *pdVar10 = a[lVar14];
          pdVar10[1] = dVar3;
          a[lVar14] = dVar1;
          (a + lVar14)[1] = dVar2;
          iVar7 = (int)lVar14 + uVar4;
          dVar1 = pdVar10[uVar4];
          dVar2 = (pdVar10 + uVar4)[1];
          dVar3 = (a + iVar7)[1];
          pdVar10[uVar4] = a[iVar7];
          (pdVar10 + uVar4)[1] = dVar3;
          a[iVar7] = dVar1;
          (a + iVar7)[1] = dVar2;
          uVar11 = uVar11 + 1;
          pdVar10 = pdVar10 + 2;
        } while (uVar9 != uVar11);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar6);
      return;
    }
    if ((int)uVar6 < 1) {
      return;
    }
  }
  uVar9 = (ulong)uVar4;
  uVar11 = 0;
  do {
    iVar7 = 0;
    if (uVar11 != 0) {
      iVar7 = ip[uVar11];
      lVar14 = (long)iVar7 << 3;
      uVar12 = 0;
      do {
        lVar13 = (long)ip[uVar12] + (long)((int)uVar11 * 2);
        dVar1 = *(double *)((long)a + lVar14);
        dVar2 = ((double *)((long)a + lVar14))[1];
        dVar3 = (a + lVar13)[1];
        *(double *)((long)a + lVar14) = a[lVar13];
        ((double *)((long)a + lVar14))[1] = dVar3;
        a[lVar13] = dVar1;
        (a + lVar13)[1] = dVar2;
        iVar8 = (int)lVar13 + uVar6 * 4;
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 8);
        dVar1 = *pdVar10;
        dVar2 = pdVar10[1];
        dVar3 = (a + iVar8)[1];
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 8);
        *pdVar10 = a[iVar8];
        pdVar10[1] = dVar3;
        a[iVar8] = dVar1;
        (a + iVar8)[1] = dVar2;
        iVar8 = iVar8 - uVar4;
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 0x10);
        dVar1 = *pdVar10;
        dVar2 = pdVar10[1];
        dVar3 = (a + iVar8)[1];
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 0x10);
        *pdVar10 = a[iVar8];
        pdVar10[1] = dVar3;
        a[iVar8] = dVar1;
        (a + iVar8)[1] = dVar2;
        iVar8 = iVar8 + uVar6 * 4;
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 0x18);
        dVar1 = *pdVar10;
        dVar2 = pdVar10[1];
        dVar3 = (a + iVar8)[1];
        pdVar10 = (double *)((long)a + lVar14 + uVar9 * 0x18);
        *pdVar10 = a[iVar8];
        pdVar10[1] = dVar3;
        a[iVar8] = dVar1;
        (a + iVar8)[1] = dVar2;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar11 != uVar12);
    }
    iVar7 = iVar7 + (uVar6 + (int)uVar11) * 2;
    dVar1 = a[iVar7];
    dVar2 = (a + iVar7)[1];
    dVar3 = (a + (int)(iVar7 + uVar4))[1];
    a[iVar7] = a[(int)(iVar7 + uVar4)];
    (a + iVar7)[1] = dVar3;
    a[(int)(iVar7 + uVar4)] = dVar1;
    (a + (int)(iVar7 + uVar4))[1] = dVar2;
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar6);
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}